

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int asn1_get_tagged_int(uchar **p,uchar *end,int tag,int *val)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  bool bVar5;
  ulong local_20;
  
  pbVar3 = *p;
  if (end == pbVar3 || (long)end - (long)pbVar3 < 0) {
    iVar2 = -0x60;
  }
  else {
    iVar2 = -0x62;
    if ((uint)*pbVar3 == tag) {
      *p = pbVar3 + 1;
      iVar2 = mbedtls_asn1_get_len(p,end,&local_20);
      if ((iVar2 == 0) && (iVar2 = -100, local_20 != 0)) {
        pbVar3 = *p;
        bVar1 = *pbVar3;
        if (-1 < (char)bVar1) {
          bVar5 = true;
          while (bVar1 == 0) {
            pbVar3 = pbVar3 + 1;
            *p = pbVar3;
            if (local_20 == 1) {
              *val = 0;
              return 0;
            }
            local_20 = local_20 - 1;
            bVar1 = *pbVar3;
            bVar5 = -1 < (char)bVar1;
          }
          if ((local_20 < 5) && ((bool)(local_20 != 4 | bVar5))) {
            *val = 0;
            iVar2 = 0;
            uVar4 = 0;
            do {
              uVar4 = uVar4 << 8 | (uint)*pbVar3;
              *val = uVar4;
              *p = pbVar3 + 1;
              local_20 = local_20 - 1;
              pbVar3 = pbVar3 + 1;
            } while (local_20 != 0);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int asn1_get_tagged_int(unsigned char **p,
                               const unsigned char *end,
                               int tag, int *val)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, tag)) != 0) {
        return ret;
    }

    /*
     * len==0 is malformed (0 must be represented as 020100 for INTEGER,
     * or 0A0100 for ENUMERATED tags
     */
    if (len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    /* This is a cryptography library. Reject negative integers. */
    if ((**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    /* Skip leading zeros. */
    while (len > 0 && **p == 0) {
        ++(*p);
        --len;
    }

    /* Reject integers that don't fit in an int. This code assumes that
     * the int type has no padding bit. */
    if (len > sizeof(int)) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    if (len == sizeof(int) && (**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    *val = 0;
    while (len-- > 0) {
        *val = (*val << 8) | **p;
        (*p)++;
    }

    return 0;
}